

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void EMIT_OP_REG(CodeGenGenericContext *ctx,x86Command op,x86Reg reg1)

{
  x86Reg reg1_local;
  x86Command op_local;
  CodeGenGenericContext *ctx_local;
  
  switch(op) {
  case o_push:
    if ((ctx->skipTracking & 1U) == 0) {
      CodeGenGenericContext::ReadRegister(ctx,reg1);
    }
    break;
  case o_pop:
    if ((ctx->skipTracking & 1U) == 0) {
      CodeGenGenericContext::OverwriteRegisterWithUnknown(ctx,reg1);
      CodeGenGenericContext::ReadRegister(ctx,reg1);
    }
    break;
  default:
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x3cb,"void EMIT_OP_REG(CodeGenGenericContext &, x86Command, x86Reg)");
  case o_call:
    CodeGenGenericContext::ReadRegister(ctx,reg1);
    CodeGenGenericContext::KillUnreadRegisters(ctx);
    CodeGenGenericContext::InvalidateState(ctx);
    break;
  case o_neg:
  case o_not:
  case o_neg64:
  case o_not64:
    CodeGenGenericContext::ReadAndModifyRegister(ctx,reg1);
    break;
  case o_imul:
  case o_imul64:
    CodeGenGenericContext::ReadRegister(ctx,reg1);
    CodeGenGenericContext::ReadAndModifyRegister(ctx,rEAX);
    CodeGenGenericContext::OverwriteRegisterWithUnknown(ctx,rEDX);
    break;
  case o_idiv:
  case o_idiv64:
    CodeGenGenericContext::ReadRegister(ctx,reg1);
    CodeGenGenericContext::ReadAndModifyRegister(ctx,rEAX);
    CodeGenGenericContext::ReadAndModifyRegister(ctx,rEDX);
    CodeGenGenericContext::ReadRegister(ctx,rEAX);
    CodeGenGenericContext::ReadRegister(ctx,rEDX);
    break;
  case o_sal:
  case o_sar:
  case o_sal64:
  case o_sar64:
    CodeGenGenericContext::ReadRegister(ctx,rECX);
    CodeGenGenericContext::ReadAndModifyRegister(ctx,reg1);
    break;
  case o_setl:
  case o_setg:
  case o_setle:
  case o_setge:
  case o_sete:
  case o_setne:
  case o_setz:
  case o_setnz:
    CodeGenGenericContext::ReadAndModifyRegister(ctx,reg1);
    break;
  case o_read_register:
    CodeGenGenericContext::ReadRegister(ctx,reg1);
    break;
  case o_kill_register:
    CodeGenGenericContext::KillRegister(ctx,reg1);
  }
  ctx->x86Op->name = op;
  (ctx->x86Op->argA).type = argReg;
  (ctx->x86Op->argA).field_1.reg = reg1;
  (ctx->x86Op->argB).type = argNone;
  ctx->x86Op = ctx->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_REG(CodeGenGenericContext &ctx, x86Command op, x86Reg reg1)
{
#ifdef NULLC_OPTIMIZE_X86
	switch(op)
	{
	case o_call:
		ctx.ReadRegister(reg1);

		ctx.KillUnreadRegisters();

		ctx.InvalidateState();
		break;
	case o_setl:
	case o_setg:
	case o_setle:
	case o_setge:
	case o_sete:
	case o_setne:
	case o_setz:
	case o_setnz:
		ctx.ReadAndModifyRegister(reg1); // Since instruction sets only lower bits, it 'reads' the rest
		break;
	case o_imul:
	case o_imul64:
		// TODO: check if direct operation with memory is possible

		ctx.ReadRegister(reg1);

		ctx.ReadAndModifyRegister(rEAX);
		ctx.OverwriteRegisterWithUnknown(rEDX); // Don't care about top bits here
		break;
	case o_idiv:
	case o_idiv64:
		// TODO: check if direct operation with memory is possible

		ctx.ReadRegister(reg1);

		ctx.ReadAndModifyRegister(rEAX);
		ctx.ReadAndModifyRegister(rEDX);

		// Implicitly read the result so when one of the registers is killed, it will not remove the instruction (there's room for improvement)
		ctx.ReadRegister(rEAX);
		ctx.ReadRegister(rEDX);
		break;
	case o_neg:
	case o_not:
	case o_neg64:
	case o_not64:
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_push:
		if(ctx.skipTracking)
			break;

		ctx.ReadRegister(reg1);
		break;
	case o_pop:
		if(ctx.skipTracking)
			break;

		ctx.OverwriteRegisterWithUnknown(reg1);

		// Push and pop are part of the frame setup, so implicitly use the register so it won't be removed
		ctx.ReadRegister(reg1);
		break;
	case o_sal:
	case o_sar:
	case o_sal64:
	case o_sar64:
		ctx.ReadRegister(rECX);

		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_read_register:
		ctx.ReadRegister(reg1);
		break;
	case o_kill_register:
		ctx.KillRegister(reg1);
		break;
	default:
		assert(!"unknown instruction");
	}
#else
	if(op == o_call)
		ctx.InvalidateState();
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argReg;
	ctx.x86Op->argA.reg = reg1;
	ctx.x86Op->argB.type = x86Argument::argNone;
	ctx.x86Op++;
}